

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

void lex_number(LexState *ls,TValue *tv)

{
  long *plVar1;
  byte *pbVar2;
  lua_State *L;
  TValue *pTVar3;
  uint uVar4;
  uint uVar5;
  StrScanFmt SVar6;
  char *pcVar7;
  GCcdata *cd;
  uint uVar8;
  uint uVar9;
  
  uVar9 = ls->c;
  if (uVar9 == 0x30) {
    uVar8 = (ls->sb).p.ptr32;
    pcVar7 = (char *)(ulong)uVar8;
    if ((ls->sb).e.ptr32 == uVar8) {
      pcVar7 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar7 = '0';
    (ls->sb).p.ptr32 = (int)pcVar7 + 1;
    pbVar2 = (byte *)ls->p;
    if (pbVar2 < ls->pe) {
      ls->p = (char *)(pbVar2 + 1);
      uVar4 = (uint)*pbVar2;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    uVar8 = 0x65;
    if ((uVar4 & 0xffffffdf) == 0x58) {
      uVar8 = 0x70;
    }
  }
  else {
    uVar8 = 0x65;
    uVar4 = uVar9;
  }
  while (((uVar4 == 0x2e || ((char)""[(long)(int)uVar4 + 1] < '\0')) ||
         (((uVar4 == 0x2d || (uVar4 == 0x2b)) && ((uVar9 | 0x20) == uVar8))))) {
    uVar9 = (ls->sb).p.ptr32;
    pcVar7 = (char *)(ulong)uVar9;
    if ((ls->sb).e.ptr32 == uVar9) {
      pcVar7 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar7 = (char)uVar4;
    (ls->sb).p.ptr32 = (int)pcVar7 + 1;
    pbVar2 = (byte *)ls->p;
    if (pbVar2 < ls->pe) {
      ls->p = (char *)(pbVar2 + 1);
      uVar5 = (uint)*pbVar2;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    uVar9 = uVar4;
    uVar4 = uVar5;
  }
  uVar9 = (ls->sb).p.ptr32;
  pcVar7 = (char *)(ulong)uVar9;
  if ((ls->sb).e.ptr32 == uVar9) {
    pcVar7 = lj_buf_more2(&ls->sb,1);
  }
  *pcVar7 = '\0';
  (ls->sb).p.ptr32 = (int)pcVar7 + 1;
  uVar9 = (ls->sb).b.ptr32;
  SVar6 = lj_strscan_scan((uint8_t *)(ulong)uVar9,(int)pcVar7 + 1 + ~uVar9,tv,0xe);
  if (SVar6 != STRSCAN_NUM) {
    if (SVar6 != STRSCAN_ERROR) {
      L = ls->L;
      if (*(int *)((ulong)(L->glref).ptr32 + 0x194) == 0) {
        pTVar3 = L->top;
        uVar9 = (L->stack).ptr32;
        luaopen_ffi(L);
        L->top = (TValue *)((long)pTVar3 + ((ulong)(L->stack).ptr32 - (ulong)uVar9));
      }
      if (SVar6 == STRSCAN_IMAG) {
        cd = (GCcdata *)lj_mem_newgco(L,0x18);
        cd->gct = '\n';
        cd->ctypeid = 0x10;
        plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
        *plVar1 = *plVar1 + 1;
        cd[1].nextgc = 0;
        cd[1].marked = '\0';
        cd[1].gct = '\0';
        cd[1].ctypeid = 0;
        *(TValue *)(cd + 2) = *tv;
      }
      else {
        cd = (GCcdata *)lj_mem_newgco(L,0x10);
        cd->gct = '\n';
        cd->ctypeid = (SVar6 != STRSCAN_I64) + 0xb;
        plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
        *plVar1 = *plVar1 + 1;
        *(TValue *)(cd + 1) = *tv;
      }
      lj_parse_keepcdata(ls,tv,cd);
      return;
    }
    lj_lex_error(ls,0x11e,LJ_ERR_XNUMBER);
  }
  return;
}

Assistant:

static void lex_number(LexState *ls, TValue *tv)
{
  StrScanFmt fmt;
  LexChar c, xp = 'e';
  lj_assertLS(lj_char_isdigit(ls->c), "bad usage");
  if ((c = ls->c) == '0' && (lex_savenext(ls) | 0x20) == 'x')
    xp = 'p';
  while (lj_char_isident(ls->c) || ls->c == '.' ||
	 ((ls->c == '-' || ls->c == '+') && (c | 0x20) == xp)) {
    c = ls->c;
    lex_savenext(ls);
  }
  lex_save(ls, '\0');
  fmt = lj_strscan_scan((const uint8_t *)sbufB(&ls->sb), sbuflen(&ls->sb)-1, tv,
	  (LJ_DUALNUM ? STRSCAN_OPT_TOINT : STRSCAN_OPT_TONUM) |
	  (LJ_HASFFI ? (STRSCAN_OPT_LL|STRSCAN_OPT_IMAG) : 0));
  if (LJ_DUALNUM && fmt == STRSCAN_INT) {
    setitype(tv, LJ_TISNUM);
  } else if (fmt == STRSCAN_NUM) {
    /* Already in correct format. */
#if LJ_HASFFI
  } else if (fmt != STRSCAN_ERROR) {
    lua_State *L = ls->L;
    GCcdata *cd;
    lj_assertLS(fmt == STRSCAN_I64 || fmt == STRSCAN_U64 || fmt == STRSCAN_IMAG,
		"unexpected number format %d", fmt);
    ctype_loadffi(L);
    if (fmt == STRSCAN_IMAG) {
      cd = lj_cdata_new_(L, CTID_COMPLEX_DOUBLE, 2*sizeof(double));
      ((double *)cdataptr(cd))[0] = 0;
      ((double *)cdataptr(cd))[1] = numV(tv);
    } else {
      cd = lj_cdata_new_(L, fmt==STRSCAN_I64 ? CTID_INT64 : CTID_UINT64, 8);
      *(uint64_t *)cdataptr(cd) = tv->u64;
    }
    lj_parse_keepcdata(ls, tv, cd);
#endif
  } else {
    lj_assertLS(fmt == STRSCAN_ERROR,
		"unexpected number format %d", fmt);
    lj_lex_error(ls, TK_number, LJ_ERR_XNUMBER);
  }
}